

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPtrPair __thiscall ON_SubDVertex::BoundaryEdgePair(ON_SubDVertex *this)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  ulong uVar2;
  ON_SubDComponentPtrPair OVar3;
  ON_SubDComponentPtrPair *local_88;
  ON__UINT_PTR edir;
  ON_SubDEdge *e;
  ON_SubDEdgePtr eptr;
  undefined1 auStack_30 [6];
  unsigned_short vei;
  ON_SubDComponentPtrPair epair;
  ON_SubDVertex *this_local;
  ON_SubDComponentPtr local_10;
  
  _auStack_30 = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  epair.m_pair[0] = ON_SubDComponentPtrPair::Null.m_pair[1];
  epair.m_pair[1].m_ptr = (ON__UINT_PTR)this;
  if ((this->m_edges != (ON_SubDEdgePtr *)0x0) && (1 < this->m_edge_count)) {
    for (eptr.m_ptr._6_2_ = 0; eptr.m_ptr._6_2_ < this->m_edge_count;
        eptr.m_ptr._6_2_ = eptr.m_ptr._6_2_ + 1) {
      e = (ON_SubDEdge *)this->m_edges[eptr.m_ptr._6_2_].m_ptr;
      this_00 = (ON_SubDEdge *)((ulong)e & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         (bVar1 = ON_SubDEdge::HasBoundaryEdgeTopology(this_00), bVar1)) {
        uVar2 = (ulong)e & 1;
        if (this != this_00->m_vertex[uVar2]) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x16fd,"","m_edges[vei] has incorrect edge orientation flag.");
          if (this != *(ON_SubDVertex **)((long)this_00 + (1 - uVar2) * 8 + 0x80)) {
            this_local = (ON_SubDVertex *)ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
            local_10.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
            goto LAB_0087156d;
          }
          e = (ON_SubDEdge *)ON_SubDEdgePtr::Reversed((ON_SubDEdgePtr *)&e);
        }
        bVar1 = ON_SubDComponentPtr::IsNull((ON_SubDComponentPtr *)auStack_30);
        if (bVar1) {
          _auStack_30 = ON_SubDComponentPtr::Create((ON_SubDEdgePtr)e);
        }
        else {
          bVar1 = ON_SubDComponentPtr::IsNull(epair.m_pair);
          if (!bVar1) {
            this_local = (ON_SubDVertex *)ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
            local_10.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
            goto LAB_0087156d;
          }
          epair.m_pair[0] = ON_SubDComponentPtr::Create((ON_SubDEdgePtr)e);
        }
      }
    }
  }
  bVar1 = ON_SubDComponentPtr::IsNotNull(epair.m_pair);
  if (bVar1) {
    local_88 = (ON_SubDComponentPtrPair *)auStack_30;
  }
  else {
    local_88 = &ON_SubDComponentPtrPair::Null;
  }
  this_local = (ON_SubDVertex *)local_88->m_pair[0].m_ptr;
  local_10.m_ptr = local_88->m_pair[1].m_ptr;
LAB_0087156d:
  OVar3.m_pair[0].m_ptr = (ON__UINT_PTR)this_local;
  OVar3.m_pair[1].m_ptr = local_10.m_ptr;
  return (ON_SubDComponentPtrPair)OVar3.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDVertex::BoundaryEdgePair() const
{
  ON_SubDComponentPtrPair epair = ON_SubDComponentPtrPair::Null;
  if (nullptr != m_edges && m_edge_count >= 2)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      ON_SubDEdgePtr eptr = m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
        continue;
      if (false == e->HasBoundaryEdgeTopology())
        continue;
      const ON__UINT_PTR edir = ON_SUBD_EDGE_DIRECTION(eptr.m_ptr);
      if (this != e->m_vertex[edir])
      {
        // m_edges[vei] is corrupt ...
        ON_SUBD_ERROR("m_edges[vei] has incorrect edge orientation flag.");
        if (this == e->m_vertex[1 - edir])
          eptr = eptr.Reversed(); // we can still return the requested information.
        else
          return ON_SubDComponentPtrPair::Null;
      }
      if (epair.m_pair[0].IsNull())
        epair.m_pair[0] = ON_SubDComponentPtr::Create(eptr);
      else if (epair.m_pair[1].IsNull())
        epair.m_pair[1] = ON_SubDComponentPtr::Create(eptr);
      else
        return ON_SubDComponentPtrPair::Null; // 3 or more boundary edges
    }
  }
  return (epair.m_pair[1].IsNotNull()) ? epair : ON_SubDComponentPtrPair::Null;
}